

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void highbd_smooth_h_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int c;
  ulong uVar5;
  long lVar6;
  byte local_26 [2];
  uint16_t local_24 [2];
  uint8_t weights [2];
  uint16_t pixels [2];
  
  local_24[1] = above[(long)bw + -1];
  uVar4 = 0;
  uVar1 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar1 = uVar4;
  }
  uVar2 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
      local_24[0] = left[uVar4];
      local_26[0] = (&DAT_0046dda4)[uVar5 + (uint)bw];
      local_26[1] = -(&DAT_0046dda4)[uVar5 + (uint)bw];
      iVar3 = 0;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar3 = iVar3 + (uint)local_24[lVar6] * (uint)local_26[lVar6];
      }
      dst[uVar5] = (uint16_t)((uint)(iVar3 + 0x80) >> 8);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_smooth_h_predictor(uint16_t *dst, ptrdiff_t stride,
                                             int bw, int bh,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}